

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit.cpp
# Opt level: O3

bool doesReverseUpdateWorks<CyclicHash<unsigned_int,unsigned_char>>(uint L)

{
  byte bVar1;
  uint uVar2;
  uint32 uVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  uint uVar7;
  bool bVar8;
  uchar c;
  deque<unsigned_char,_std::allocator<unsigned_char>_> s;
  mersenneRNG generator;
  byte local_1841;
  uint32 local_1840;
  _Deque_base<unsigned_char,_std::allocator<unsigned_char>_> local_1838;
  CyclicHash<unsigned_int,_unsigned_char> local_17e0;
  MTRand local_13c8;
  int local_38;
  
  MTRand::seed(&local_13c8);
  local_38 = 5;
  iVar6 = 3;
  CyclicHash<unsigned_int,_unsigned_char>::CyclicHash(&local_17e0,3,L);
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_last = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_cur = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_start._M_first = (byte *)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1838._M_impl.super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_initialize_map(&local_1838,0);
  do {
    local_1840 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_1840);
    local_1841 = (char)uVar3 + 0x41;
    if (local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,std::allocator<unsigned_char>>::
      _M_push_back_aux<unsigned_char_const&>
                ((deque<unsigned_char,std::allocator<unsigned_char>> *)&local_1838,&local_1841);
    }
    else {
      *local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = local_1841;
      local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    local_17e0.hashvalue =
         (local_17e0.hashvalue >> ((char)local_17e0.wordsize - 1U & 0x1f) |
         (local_17e0.mask1 & local_17e0.hashvalue) * 2) ^ local_17e0.hasher.hashvalues[local_1841];
    iVar6 = iVar6 + -1;
  } while (iVar6 != 0);
  bVar8 = false;
  uVar7 = 0;
  do {
    bVar1 = *local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
    if (local_1838._M_impl.super__Deque_impl_data._M_start._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_start._M_last + -1) {
      operator_delete(local_1838._M_impl.super__Deque_impl_data._M_start._M_first);
      local_1838._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_node[1];
      local_1838._M_impl.super__Deque_impl_data._M_start._M_last =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 0x200;
      local_1838._M_impl.super__Deque_impl_data._M_start._M_first =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur;
      local_1838._M_impl.super__Deque_impl_data._M_start._M_node =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_node + 1;
    }
    else {
      local_1838._M_impl.super__Deque_impl_data._M_start._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_start._M_cur + 1;
    }
    local_1840 = (uint32)local_38;
    uVar3 = MTRand::randInt(&local_13c8,&local_1840);
    bVar5 = (char)uVar3 + 0x41;
    local_1840 = CONCAT71(local_1840._1_7_,bVar5);
    if (local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur ==
        local_1838._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_char,_std::allocator<unsigned_char>_>::_M_push_back_aux<unsigned_char>
                ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1838,
                 (uchar *)&local_1840);
    }
    else {
      *local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur = bVar5;
      local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur =
           local_1838._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
    }
    uVar2 = local_17e0.hasher.hashvalues[bVar1];
    bVar1 = (char)local_17e0.wordsize - 1;
    uVar4 = local_17e0.hashvalue >> (bVar1 & 0x1f);
    uVar4 = (uVar4 & 1) << (bVar1 & 0x1f) |
            ((local_17e0.mask1 & local_17e0.hashvalue) * 2 | uVar4) >> 1;
    local_17e0.hashvalue =
         (uVar4 >> (bVar1 & 0x1f) | (local_17e0.mask1 & uVar4) * 2) ^
         (uVar2 >> ((char)local_17e0.wordsize - (byte)local_17e0.myr & 0x1f) |
         (local_17e0.maskn & uVar2) << ((byte)local_17e0.myr & 0x1f)) ^
         local_17e0.hasher.hashvalues[bVar5];
    uVar2 = CyclicHash<unsigned_int,unsigned_char>::
            hash<std::deque<unsigned_char,std::allocator<unsigned_char>>>
                      ((CyclicHash<unsigned_int,unsigned_char> *)&local_17e0,
                       (deque<unsigned_char,_std::allocator<unsigned_char>_> *)&local_1838);
    if (uVar2 != local_17e0.hashvalue) break;
    bVar8 = 0x1869e < uVar7;
    uVar7 = uVar7 + 1;
  } while (uVar7 != 100000);
  std::_Deque_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Deque_base(&local_1838);
  return bVar8;
}

Assistant:

bool doesReverseUpdateWorks(uint L = 7) {
  mersenneRNG generator(5);
  const uint n(3); // n-grams
  hashfunction hf(n, L);
  deque<unsigned char> s;
  for (uint32 k = 0; k < n; ++k) {
    unsigned char c = static_cast<unsigned char>(generator() + 65);
    s.push_back(c);
    hf.eat(c);
  }
  for (uint32 k = 0; k < 100000; ++k) {
    unsigned char out = s.front();
    s.pop_front();
    char c(generator() + 65);
    s.push_back(c);
    hf.update(out, c);
    hf.reverse_update(out, c);
    hf.update(out, c);
    if (hf.hash(s) != hf.hashvalue) {
      return false;
    }
  }
  return true;
}